

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

int lws_client_stash_create(lws *wsi,char **cisin)

{
  int iVar1;
  size_t sVar2;
  client_info_stash *pcVar3;
  long lVar4;
  char *__s;
  size_t size;
  
  size = 0x49;
  lVar4 = 0;
  do {
    if (cisin[lVar4] != (char *)0x0) {
      sVar2 = strlen(cisin[lVar4]);
      size = size + sVar2 + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  if (wsi->stash != (client_info_stash *)0x0) {
    lws_realloc(wsi->stash,0,"free");
    wsi->stash = (client_info_stash *)0x0;
  }
  pcVar3 = (client_info_stash *)lws_realloc((void *)0x0,size,"client stash");
  wsi->stash = pcVar3;
  if (pcVar3 == (client_info_stash *)0x0) {
    iVar1 = 1;
  }
  else {
    pcVar3->cis[6] = (char *)0x0;
    pcVar3->cis[7] = (char *)0x0;
    pcVar3->cis[4] = (char *)0x0;
    pcVar3->cis[5] = (char *)0x0;
    pcVar3->cis[2] = (char *)0x0;
    pcVar3->cis[3] = (char *)0x0;
    pcVar3->cis[0] = (char *)0x0;
    pcVar3->cis[1] = (char *)0x0;
    pcVar3->opaque_user_data = (void *)0x0;
    pcVar3 = wsi->stash + 1;
    lVar4 = 0;
    do {
      if (cisin[lVar4] != (char *)0x0) {
        wsi->stash->cis[lVar4] = (char *)pcVar3;
        __s = cisin[lVar4];
        if ((lVar4 == 1) && (*__s != '/')) {
          *(undefined1 *)pcVar3->cis = 0x2f;
          pcVar3 = (client_info_stash *)((long)pcVar3->cis + 1);
          __s = cisin[1];
        }
        sVar2 = strlen(__s);
        memcpy(pcVar3,__s,sVar2 + 1);
        pcVar3 = (client_info_stash *)((long)pcVar3->cis + sVar2 + 1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
lws_client_stash_create(struct lws *wsi, const char **cisin)
{
	size_t size;
	char *pc;
	int n;

	size = sizeof(*wsi->stash) + 1;

	/*
	 * Let's overallocate the stash object with space for all the args
	 * in one hit.
	 */
	for (n = 0; n < CIS_COUNT; n++)
		if (cisin[n])
			size += strlen(cisin[n]) + 1;

	if (wsi->stash)
		lws_free_set_NULL(wsi->stash);

	wsi->stash = lws_malloc(size, "client stash");
	if (!wsi->stash)
		return 1;

	/* all the pointers default to NULL, but no need to zero the args */
	memset(wsi->stash, 0, sizeof(*wsi->stash));

	pc = (char *)&wsi->stash[1];

	for (n = 0; n < CIS_COUNT; n++)
		if (cisin[n]) {
			size_t mm;
			wsi->stash->cis[n] = pc;
			if (n == CIS_PATH && cisin[n][0] != '/')
				*pc++ = '/';
			mm = strlen(cisin[n]) + 1;
			memcpy(pc, cisin[n], mm);
			pc += mm;
		}

	return 0;
}